

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_BrepFace * __thiscall
ON_Brep::NewRuledFace
          (ON_Brep *this,ON_BrepEdge *edgeA,bool bRevEdgeA,ON_BrepEdge *edgeB,bool bRevEdgeB)

{
  ON_3dPoint point;
  ON_3dPoint point_00;
  int iVar1;
  ON_BrepEdge *pOVar2;
  ON_NurbsSurface *this_00;
  ON_BrepFace *face;
  ON_BrepEdge *west_edge;
  ON_BrepEdge *east_edge;
  int iStack_138;
  bool bRev3d [4];
  int eid [4];
  int local_e8;
  int iStack_e4;
  int vid [4];
  ON_NurbsSurface *srf;
  undefined1 local_b8 [8];
  ON_NurbsCurve cB;
  ON_NurbsCurve cA;
  bool bRevEdgeB_local;
  ON_BrepEdge *edgeB_local;
  bool bRevEdgeA_local;
  ON_BrepEdge *edgeA_local;
  ON_Brep *this_local;
  
  if (edgeA->m_edge_index == edgeB->m_edge_index) {
    this_local = (ON_Brep *)0x0;
  }
  else {
    pOVar2 = Edge(this,edgeA->m_edge_index);
    if (pOVar2 == edgeA) {
      pOVar2 = Edge(this,edgeB->m_edge_index);
      if (pOVar2 == edgeB) {
        ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)&cB.m_cv);
        ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_b8);
        iVar1 = (*(edgeA->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x3f])(0,edgeA,&cB.m_cv,0);
        if (iVar1 == 0) {
          this_local = (ON_Brep *)0x0;
        }
        else {
          if (bRevEdgeA) {
            ON_NurbsCurve::Reverse((ON_NurbsCurve *)&cB.m_cv);
          }
          iVar1 = (*(edgeB->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                    _vptr_ON_Object[0x3f])(0,edgeB,local_b8,0);
          if (iVar1 == 0) {
            this_local = (ON_Brep *)0x0;
          }
          else {
            if (bRevEdgeB) {
              ON_NurbsCurve::Reverse((ON_NurbsCurve *)local_b8);
            }
            this_00 = ON_NurbsSurface::New();
            iVar1 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0x40])(this_00,&cB.m_cv,local_b8);
            if (iVar1 == 0) {
              if (this_00 != (ON_NurbsSurface *)0x0) {
                (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                          ();
              }
              this_local = (ON_Brep *)0x0;
            }
            else {
              _local_e8 = CONCAT44(edgeA->m_vi[(int)(uint)!bRevEdgeA],
                                   edgeA->m_vi[(int)(uint)bRevEdgeA]);
              vid[1] = edgeB->m_vi[(int)(uint)bRevEdgeB];
              vid[0] = edgeB->m_vi[(int)(uint)!bRevEdgeB];
              if (edgeA->m_vi[(int)(uint)!bRevEdgeA] == edgeB->m_vi[(int)(uint)!bRevEdgeB]) {
                point.y = ON_3dPoint::UnsetPoint.y;
                point.x = ON_3dPoint::UnsetPoint.x;
                point.z = ON_3dPoint::UnsetPoint.z;
                ON_NurbsSurface::CollapseSide(this_00,1,point);
              }
              if (iStack_e4 == vid[0]) {
                point_00.y = ON_3dPoint::UnsetPoint.y;
                point_00.x = ON_3dPoint::UnsetPoint.x;
                point_00.z = ON_3dPoint::UnsetPoint.z;
                ON_NurbsSurface::CollapseSide(this_00,3,point_00);
              }
              _iStack_138 = CONCAT44(0xffffffff,edgeA->m_edge_index);
              east_edge._4_4_ = (uint)bRevEdgeA;
              pOVar2 = FindLinearEdge(this,iStack_e4,vid[0]);
              if (pOVar2 != (ON_BrepEdge *)0x0) {
                _iStack_138 = CONCAT44(pOVar2->m_edge_index,iStack_138);
                east_edge._4_2_ = CONCAT11(pOVar2->m_vi[0] == vid[0],east_edge._4_1_);
              }
              east_edge._4_4_ =
                   CONCAT13(east_edge._7_1_,CONCAT12(~bRevEdgeB,east_edge._4_2_)) & 0xff01ffff;
              pOVar2 = FindLinearEdge(this,vid[1],local_e8);
              if (pOVar2 != (ON_BrepEdge *)0x0) {
                east_edge._4_4_ = CONCAT13(pOVar2->m_vi[0] == local_e8,east_edge._4_3_);
              }
              this_local = (ON_Brep *)
                           NewFace(this,&this_00->super_ON_Surface,&local_e8,&iStack_138,
                                   (bool *)((long)&east_edge + 4));
              if (this_local != (ON_Brep *)0x0) {
                SynchFaceOrientation
                          (this,(this_local->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity);
              }
            }
          }
        }
        ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_b8);
        ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)&cB.m_cv);
      }
      else {
        this_local = (ON_Brep *)0x0;
      }
    }
    else {
      this_local = (ON_Brep *)0x0;
    }
  }
  return (ON_BrepFace *)this_local;
}

Assistant:

ON_BrepFace* ON_Brep::NewRuledFace(
      const ON_BrepEdge& edgeA,
      bool bRevEdgeA,
      const ON_BrepEdge& edgeB, 
      bool bRevEdgeB
      )
{
  if ( edgeA.m_edge_index == edgeB.m_edge_index )
    return nullptr;
  if ( Edge( edgeA.m_edge_index) != &edgeA )
    return nullptr;
  if ( Edge( edgeB.m_edge_index) != &edgeB )
    return nullptr;

  ON_NurbsCurve cA, cB;
  if ( !edgeA.GetNurbForm( cA ) )
    return nullptr;
  if ( bRevEdgeA )
    cA.Reverse();
  if ( !edgeB.GetNurbForm( cB ) )
    return nullptr;
  if ( bRevEdgeB )
    cB.Reverse();
  ON_NurbsSurface* srf = ON_NurbsSurface::New();
  if ( !srf->CreateRuledSurface( cA, cB ) )
  {
    delete srf;
    return nullptr;
  }

  // corner vertices (sw,se,ne,nw)
  int vid[4] = {-1,-1,-1,-1};
  vid[0] = edgeA.m_vi[bRevEdgeA?1:0];
  vid[1] = edgeA.m_vi[bRevEdgeA?0:1];
  vid[2] = edgeB.m_vi[bRevEdgeB?0:1];
  vid[3] = edgeB.m_vi[bRevEdgeB?1:0];

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular east side
    srf->CollapseSide( 1 );
  }

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular west side
    srf->CollapseSide( 3 );
  }

  // side edges (s,e,n,w)
  int eid[4] = {-1,-1,-1,-1};
  bool bRev3d[4] = {false,false,false,false};
  
  // south side
  eid[0] = edgeA.m_edge_index;
  bRev3d[0] = bRevEdgeA;
  
  // east side
  const ON_BrepEdge* east_edge = FindLinearEdge( *this, vid[1], vid[2] );
  if ( east_edge )
  {
    eid[1] = east_edge->m_edge_index;
    bRev3d[1] = (east_edge->m_vi[0] == vid[2]);
  }

  // north side
  eid[2] = edgeB.m_edge_index;
  bRev3d[2] = !bRevEdgeB;

  // west side
  const ON_BrepEdge* west_edge = FindLinearEdge( *this, vid[3], vid[0] );
  if ( west_edge )
  {
    eid[3] = west_edge->m_edge_index;
    bRev3d[3] = (west_edge->m_vi[0] == vid[0]);
  }

  ON_BrepFace* face = NewFace( srf, vid, eid, bRev3d );
  if ( face )
    SynchFaceOrientation( *this, face->m_face_index );
  return face;
}